

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::Connect
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aBorderAgentAddr,
          uint16_t aBorderAgentPort)

{
  uint16_t aBorderAgentPort_local;
  string *aBorderAgentAddr_local;
  CommissionerApp *this_local;
  
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::Connect(const std::string &aBorderAgentAddr, uint16_t aBorderAgentPort)
{
    UNUSED(aBorderAgentAddr);
    UNUSED(aBorderAgentPort);
    return Error{};
}